

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  ModuleFieldType MVar1;
  Errors *errors;
  bool bVar2;
  Result RVar3;
  TokenTypePair TVar4;
  reference pMVar5;
  bool bVar6;
  ImportModuleField *import_field;
  _func_int **pp_Var7;
  FuncDeclaration *decl;
  Func *func;
  iterator rhs;
  ResolveFuncTypesExprVisitorDelegate delegate;
  iterator __begin2;
  ExprVisitor local_80;
  
  while (((TVar4 = PeekPair(this), TVar4._M_elems[0] == Lpar && (TVar4._M_elems[1] < I8X16)) &&
         ((0x150011ad400U >> ((ulong)TVar4._M_elems >> 0x20 & 0x3f) & 1) != 0))) {
    RVar3 = ParseModuleField(this,module);
    if ((RVar3.enum_ == Error) &&
       (RVar3 = Synchronize(this,anon_unknown_1::IsModuleField), RVar3.enum_ == Error)) {
      return (Result)Error;
    }
  }
  RVar3 = ResolveNamesModule(module,this->errors_);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  errors = this->errors_;
  __begin2.node_ = (module->fields).first_;
  bVar6 = false;
  __begin2.list_ = &module->fields;
  do {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = &module->fields;
    bVar2 = intrusive_list<wabt::ModuleField>::iterator::operator!=(&__begin2,rhs);
    if (!bVar2) {
      return (Result)(uint)bVar6;
    }
    pMVar5 = intrusive_list<wabt::ModuleField>::iterator::operator*(&__begin2);
    MVar1 = pMVar5->type_;
    if (MVar1 == Event) {
      decl = (FuncDeclaration *)&pMVar5[1].loc.filename.size_;
LAB_00168be8:
      func = (Func *)0x0;
LAB_00168beb:
      anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
      anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar5->loc,module,decl);
      RVar3 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar5->loc,module,decl,errors);
      bVar6 = RVar3.enum_ == Error || bVar6;
      if (func != (Func *)0x0) {
        delegate.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__Delegate_001bf950
        ;
        delegate.module_ = module;
        delegate.errors_ = errors;
        ExprVisitor::ExprVisitor(&local_80,(Delegate *)&delegate);
        RVar3 = ExprVisitor::VisitFunc(&local_80,func);
        bVar6 = bVar6 || RVar3.enum_ == Error;
        ExprVisitor::~ExprVisitor(&local_80);
      }
    }
    else {
      if (MVar1 == Import) {
        pp_Var7 = pMVar5[1]._vptr_ModuleField;
        if (pp_Var7 == (_func_int **)0x0 || *(int *)(pp_Var7 + 9) != 0) {
          if (*(int *)(pp_Var7 + 9) != 4) {
            pp_Var7 = (_func_int **)0x0;
          }
          if (pp_Var7 == (_func_int **)0x0) goto LAB_00168c81;
        }
        decl = (FuncDeclaration *)(pp_Var7 + 0xe);
        goto LAB_00168be8;
      }
      if (MVar1 == Func) {
        func = (Func *)(pMVar5 + 1);
        decl = (FuncDeclaration *)&pMVar5[1].loc.filename.size_;
        goto LAB_00168beb;
      }
    }
LAB_00168c81:
    intrusive_list<wabt::ModuleField>::iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  return Result::Ok;
}